

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prompts.c
# Opt level: O2

void add_prompt(prompts_t *p,char *promptstr,_Bool echo)

{
  size_t sVar1;
  prompt_t *ppVar2;
  strbuf *psVar3;
  prompt_t **pppVar4;
  
  ppVar2 = (prompt_t *)safemalloc(1,0x18,0);
  ppVar2->prompt = promptstr;
  ppVar2->echo = echo;
  psVar3 = strbuf_new_nm();
  ppVar2->result = psVar3;
  pppVar4 = (prompt_t **)safegrowarray(p->prompts,&p->prompts_size,8,p->n_prompts,1,false);
  p->prompts = pppVar4;
  sVar1 = p->n_prompts;
  p->n_prompts = sVar1 + 1;
  pppVar4[sVar1] = ppVar2;
  return;
}

Assistant:

void add_prompt(prompts_t *p, char *promptstr, bool echo)
{
    prompt_t *pr = snew(prompt_t);
    pr->prompt = promptstr;
    pr->echo = echo;
    pr->result = strbuf_new_nm();
    sgrowarray(p->prompts, p->prompts_size, p->n_prompts);
    p->prompts[p->n_prompts++] = pr;
}